

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O1

complex_t __thiscall Iir::Cascade::response(Cascade *this,double normalizedFrequency)

{
  invalid_argument *this_00;
  int iVar1;
  Biquad *pBVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qb;
  double dVar5;
  double dVar6;
  complex_t cVar7;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  complex<double> local_68;
  complex<double> local_58;
  double local_48;
  
  if (0.5 < normalizedFrequency) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"The normalised frequency needs to be =< 0.5.");
  }
  else {
    if (0.0 <= normalizedFrequency) {
      local_98 = normalizedFrequency * 6.283185307179586;
      dVar3 = -local_98;
      local_88 = cos(dVar3);
      dStack_80 = extraout_XMM0_Qb;
      local_48 = sin(dVar3);
      local_98 = local_98 * -2.0;
      dVar3 = cos(local_98);
      dVar4 = sin(local_98);
      local_58._M_value._0_8_ = 0x3ff0000000000000;
      local_58._M_value._8_8_ = 0;
      local_68._M_value._0_8_ = 0x3ff0000000000000;
      local_68._M_value._8_8_ = 0;
      if (0 < this->m_numStages) {
        pBVar2 = this->m_stageArray;
        dStack_80 = local_48;
        iVar1 = this->m_numStages + 1;
        do {
          dVar6 = (pBVar2->m_b1 * pBVar2->m_a0) / pBVar2->m_a0;
          dVar5 = (pBVar2->m_b2 * pBVar2->m_a0) / pBVar2->m_a0;
          local_a8 = dVar5 * dVar3 + dVar6 * local_88 + (pBVar2->m_b0 * pBVar2->m_a0) / pBVar2->m_a0
          ;
          dStack_a0 = dVar5 * dVar4 + dVar6 * dStack_80 + 0.0;
          dVar6 = (pBVar2->m_a1 * pBVar2->m_a0) / pBVar2->m_a0;
          dVar5 = (pBVar2->m_a2 * pBVar2->m_a0) / pBVar2->m_a0;
          local_78 = dVar5 * dVar3 + dVar6 * local_88 + 1.0;
          dStack_70 = dVar5 * dVar4 + dVar6 * dStack_80 + 0.0;
          std::complex<double>::operator*=(&local_58,(complex<double> *)&local_a8);
          std::complex<double>::operator*=(&local_68,(complex<double> *)&local_78);
          pBVar2 = pBVar2 + 1;
          iVar1 = iVar1 + -1;
        } while (1 < iVar1);
      }
      cVar7._M_value =
           (_ComplexT)
           __divdc3(local_58._M_value._0_8_,local_58._M_value._8_8_,local_68._M_value._0_8_,
                    local_68._M_value._8_8_);
      return (complex_t)cVar7._M_value;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"The normalised frequency needs to be >= 0.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

complex_t Cascade::response (double normalizedFrequency) const
	{
		if (normalizedFrequency > 0.5) throw_invalid_argument(maxFError);
		if (normalizedFrequency < 0.0) throw_invalid_argument(minFError);
		double w = 2 * doublePi * normalizedFrequency;
		const complex_t czn1 = std::polar (1., -w);
		const complex_t czn2 = std::polar (1., -2 * w);
		complex_t ch (1);
		complex_t cbot (1);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0; ++stage)
		{
			complex_t cb (1);
			complex_t ct    (stage->getB0()/stage->getA0());
			ct = addmul (ct, stage->getB1()/stage->getA0(), czn1);
			ct = addmul (ct, stage->getB2()/stage->getA0(), czn2);
			cb = addmul (cb, stage->getA1()/stage->getA0(), czn1);
			cb = addmul (cb, stage->getA2()/stage->getA0(), czn2);
			ch   *= ct;
			cbot *= cb;
		}

		return ch / cbot;
	}